

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_action.cc
# Opt level: O0

void re2c::need(OutputFile *o,uint32_t ind,bool *readCh,size_t n,bool bSetMarker)

{
  opt_t *poVar1;
  OutputFile *pOVar2;
  string local_c0;
  string local_a0;
  string local_80;
  string local_50;
  uint32_t local_30;
  byte local_29;
  uint32_t fillIndex;
  bool bSetMarker_local;
  size_t n_local;
  bool *readCh_local;
  OutputFile *pOStack_10;
  uint32_t ind_local;
  OutputFile *o_local;
  
  local_29 = bSetMarker;
  _fillIndex = n;
  n_local = (size_t)readCh;
  readCh_local._4_4_ = ind;
  pOStack_10 = o;
  poVar1 = Opt::operator->((Opt *)&opts);
  if (poVar1->target != DOT) {
    local_30 = last_fill_index;
    poVar1 = Opt::operator->((Opt *)&opts);
    if ((poVar1->fFlag & 1U) != 0) {
      last_fill_index = last_fill_index + 1;
      genSetState(pOStack_10,readCh_local._4_4_,local_30);
    }
    poVar1 = Opt::operator->((Opt *)&opts);
    if (((poVar1->fill_use & 1U) != 0) && (_fillIndex != 0)) {
      OutputFile::wind(pOStack_10,readCh_local._4_4_);
      if (_fillIndex == 1) {
        poVar1 = Opt::operator->((Opt *)&opts);
        if ((poVar1->fill_check & 1U) != 0) {
          pOVar2 = OutputFile::ws(pOStack_10,"if (");
          poVar1 = Opt::operator->((Opt *)&opts);
          InputAPI::expr_lessthan_one_abi_cxx11_(&local_50,&poVar1->input_api);
          pOVar2 = OutputFile::wstring(pOVar2,&local_50);
          OutputFile::ws(pOVar2,") ");
          std::__cxx11::string::~string((string *)&local_50);
        }
        genYYFill(pOStack_10,_fillIndex);
      }
      else {
        poVar1 = Opt::operator->((Opt *)&opts);
        if ((poVar1->fill_check & 1U) != 0) {
          pOVar2 = OutputFile::ws(pOStack_10,"if (");
          poVar1 = Opt::operator->((Opt *)&opts);
          InputAPI::expr_lessthan_abi_cxx11_(&local_80,&poVar1->input_api,_fillIndex);
          pOVar2 = OutputFile::wstring(pOVar2,&local_80);
          OutputFile::ws(pOVar2,") ");
          std::__cxx11::string::~string((string *)&local_80);
        }
        genYYFill(pOStack_10,_fillIndex);
      }
    }
    poVar1 = Opt::operator->((Opt *)&opts);
    pOVar2 = pOStack_10;
    if ((poVar1->fFlag & 1U) != 0) {
      poVar1 = Opt::operator->((Opt *)&opts);
      pOVar2 = OutputFile::wstring(pOVar2,&poVar1->yyfilllabel);
      pOVar2 = OutputFile::wu32(pOVar2,local_30);
      OutputFile::ws(pOVar2,":\n");
    }
    pOVar2 = pOStack_10;
    if (_fillIndex != 0) {
      if ((local_29 & 1) == 0) {
        poVar1 = Opt::operator->((Opt *)&opts);
        InputAPI::stmt_peek_abi_cxx11_(&local_c0,&poVar1->input_api,readCh_local._4_4_);
        OutputFile::wstring(pOVar2,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      else {
        poVar1 = Opt::operator->((Opt *)&opts);
        InputAPI::stmt_backup_peek_abi_cxx11_(&local_a0,&poVar1->input_api,readCh_local._4_4_);
        OutputFile::wstring(pOVar2,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
      }
      *(undefined1 *)n_local = 0;
    }
  }
  return;
}

Assistant:

void need (OutputFile & o, uint32_t ind, bool & readCh, size_t n, bool bSetMarker)
{
	if (opts->target == opt_t::DOT)
	{
		return;
	}

	uint32_t fillIndex = last_fill_index;

	if (opts->fFlag)
	{
		last_fill_index++;
		genSetState (o, ind, fillIndex);
	}

	if (opts->fill_use && n > 0)
	{
		o.wind(ind);
		if (n == 1)
		{
			if (opts->fill_check)
			{
				o.ws("if (").wstring(opts->input_api.expr_lessthan_one ()).ws(") ");
			}
			genYYFill(o, n);
		}
		else
		{
			if (opts->fill_check)
			{
				o.ws("if (").wstring(opts->input_api.expr_lessthan (n)).ws(") ");
			}
			genYYFill(o, n);
		}
	}

	if (opts->fFlag)
	{
		o.wstring(opts->yyfilllabel).wu32(fillIndex).ws(":\n");
	}

	if (n > 0)
	{
		if (bSetMarker)
		{
			o.wstring(opts->input_api.stmt_backup_peek (ind));
		}
		else
		{
			o.wstring(opts->input_api.stmt_peek (ind));
		}
		readCh = false;
	}
}